

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgesture.cpp
# Opt level: O0

void QSwipeGesture::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qreal *pqVar1;
  SwipeDirection SVar2;
  QSwipeGesturePrivate *pQVar3;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  qreal qVar4;
  void *_v_1;
  void *_v;
  QSwipeGesture *_t;
  QSwipeGesture *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  
  if (in_ESI == 1) {
    pqVar1 = (qreal *)*in_RCX;
    switch(in_EDX) {
    case 0:
      SVar2 = horizontalDirection(in_stack_ffffffffffffffb8);
      *(SwipeDirection *)pqVar1 = SVar2;
      break;
    case 1:
      SVar2 = verticalDirection(in_stack_ffffffffffffffb8);
      *(SwipeDirection *)pqVar1 = SVar2;
      break;
    case 2:
      qVar4 = swipeAngle((QSwipeGesture *)0x2fe375);
      *pqVar1 = qVar4;
      break;
    case 3:
      pQVar3 = d_func((QSwipeGesture *)0x2fe38a);
      qVar4 = QSwipeGesturePrivate::velocity(pQVar3);
      *pqVar1 = qVar4;
    }
  }
  if (in_ESI == 2) {
    pqVar1 = (qreal *)*in_RCX;
    if (in_EDX == 2) {
      setSwipeAngle((QSwipeGesture *)CONCAT44(2,in_stack_ffffffffffffffc0),
                    (qreal)in_stack_ffffffffffffffb8);
    }
    else if (in_EDX == 3) {
      pQVar3 = d_func((QSwipeGesture *)0x2fe3ee);
      QSwipeGesturePrivate::setVelocity(pQVar3,*pqVar1);
    }
  }
  return;
}

Assistant:

void QSwipeGesture::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSwipeGesture *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<SwipeDirection*>(_v) = _t->horizontalDirection(); break;
        case 1: *reinterpret_cast<SwipeDirection*>(_v) = _t->verticalDirection(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->swipeAngle(); break;
        case 3: *reinterpret_cast<qreal*>(_v) = _t->QSwipeGesture::d_func()->velocity(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 2: _t->setSwipeAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->QSwipeGesture::d_func()->setVelocity(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
}